

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

char * print_set_type(lyxp_set *set)

{
  lyxp_set *set_local;
  
  switch(set->type) {
  case LYXP_SET_EMPTY:
    set_local = (lyxp_set *)anon_var_dwarf_174e5;
    break;
  case LYXP_SET_NODE_SET:
    set_local = (lyxp_set *)0x207bd1;
    break;
  case LYXP_SET_SNODE_SET:
    set_local = (lyxp_set *)anon_var_dwarf_4b1ab;
    break;
  case LYXP_SET_BOOLEAN:
    set_local = (lyxp_set *)anon_var_dwarf_174cd;
    break;
  case LYXP_SET_NUMBER:
    set_local = (lyxp_set *)0x20b745;
    break;
  case LYXP_SET_STRING:
    set_local = (lyxp_set *)0x20b848;
    break;
  default:
    set_local = (lyxp_set *)0x0;
  }
  return (char *)set_local;
}

Assistant:

static const char *
print_set_type(struct lyxp_set *set)
{
    switch (set->type) {
    case LYXP_SET_EMPTY:
        return "empty";
    case LYXP_SET_NODE_SET:
        return "node set";
    case LYXP_SET_SNODE_SET:
        return "schema node set";
    case LYXP_SET_BOOLEAN:
        return "boolean";
    case LYXP_SET_NUMBER:
        return "number";
    case LYXP_SET_STRING:
        return "string";
    }

    return NULL;
}